

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_create.c
# Opt level: O1

int mbedtls_x509_write_names(uchar **p,uchar *start,mbedtls_asn1_named_data *first)

{
  long *oid;
  uchar *text;
  size_t text_len;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  size_t len;
  ulong uVar6;
  size_t sVar7;
  
  if (first == (mbedtls_asn1_named_data *)0x0) {
    len = 0;
  }
  else {
    len = 0;
    do {
      sVar7 = (first->oid).len;
      oid = (long *)(first->oid).p;
      text = (first->val).p;
      text_len = (first->val).len;
      if ((sVar7 == 9) && ((char)oid[1] == '\x01' && *oid == 0x9010df78648862a)) {
        uVar1 = mbedtls_asn1_write_ia5_string(p,start,(char *)text,text_len);
      }
      else {
        uVar1 = mbedtls_asn1_write_printable_string(p,start,(char *)text,text_len);
      }
      uVar6 = (ulong)uVar1;
      if (-1 < (int)uVar1) {
        uVar2 = mbedtls_asn1_write_oid(p,start,(char *)oid,sVar7);
        if ((int)uVar2 < 0) {
          uVar6 = (ulong)uVar2;
        }
        else {
          uVar3 = mbedtls_asn1_write_len(p,start,(ulong)(uVar2 + uVar1));
          uVar6 = (ulong)uVar3;
          if (-1 < (int)uVar3) {
            uVar3 = mbedtls_asn1_write_tag(p,start,'0');
            if ((int)uVar3 < 0) {
LAB_0010c1b9:
              uVar6 = (ulong)uVar3;
            }
            else {
              sVar7 = (ulong)(uVar2 + uVar1) + (ulong)uVar3 + uVar6;
              uVar1 = mbedtls_asn1_write_len(p,start,sVar7);
              uVar6 = (ulong)uVar1;
              if (-1 < (int)uVar1) {
                uVar3 = mbedtls_asn1_write_tag(p,start,'1');
                if ((int)uVar3 < 0) goto LAB_0010c1b9;
                uVar6 = (ulong)(uVar1 + (int)sVar7 + uVar3);
              }
            }
          }
        }
      }
      if ((int)uVar6 < 0) {
        return (int)uVar6;
      }
      len = len + uVar6;
      first = first->next;
    } while (first != (mbedtls_asn1_named_data *)0x0);
  }
  iVar4 = mbedtls_asn1_write_len(p,start,len);
  iVar5 = iVar4;
  if ((-1 < iVar4) && (iVar5 = mbedtls_asn1_write_tag(p,start,'0'), -1 < iVar5)) {
    iVar5 = iVar4 + (int)len + iVar5;
  }
  return iVar5;
}

Assistant:

int mbedtls_x509_write_names( unsigned char **p, unsigned char *start,
                      mbedtls_asn1_named_data *first )
{
    int ret;
    size_t len = 0;
    mbedtls_asn1_named_data *cur = first;

    while( cur != NULL )
    {
        MBEDTLS_ASN1_CHK_ADD( len, x509_write_name( p, start, (char *) cur->oid.p,
                                            cur->oid.len,
                                            cur->val.p, cur->val.len ) );
        cur = cur->next;
    }

    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_len( p, start, len ) );
    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_asn1_write_tag( p, start, MBEDTLS_ASN1_CONSTRUCTED |
                                                 MBEDTLS_ASN1_SEQUENCE ) );

    return( (int) len );
}